

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_iterator.h
# Opt level: O0

ScriptElement * __thiscall
cfd::core::IteratorWrapper<cfd::core::ScriptElement>::next
          (ScriptElement *__return_storage_ptr__,IteratorWrapper<cfd::core::ScriptElement> *this)

{
  bool bVar1;
  CfdException *this_00;
  reference element;
  reference element_00;
  __normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>_>
  local_48 [3];
  CfdSourceLocation local_30;
  IteratorWrapper<cfd::core::ScriptElement> *local_18;
  IteratorWrapper<cfd::core::ScriptElement> *this_local;
  
  local_18 = this;
  this_local = (IteratorWrapper<cfd::core::ScriptElement> *)__return_storage_ptr__;
  bVar1 = hasNext(this);
  if (!bVar1) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/../include/cfdcore/cfdcore_iterator.h"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x51;
    local_30.funcname = "next";
    logger::warn<std::__cxx11::string&>
              (&local_30,"Iterator reference out of range. error_message={}.",&this->error_message_)
    ;
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    CfdException::CfdException(this_00,kCfdOutOfRangeError,&this->error_message_);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((this->reverse_ & 1U) == 0) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
               ::operator++(&this->iterator_,0);
    element_00 = __gnu_cxx::
                 __normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                 ::operator*(&local_50);
    ScriptElement::ScriptElement(__return_storage_ptr__,element_00);
  }
  else {
    ::std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>_>
    ::operator++(local_48,(int)this + 0x28);
    element = ::std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>_>
              ::operator*(local_48);
    ScriptElement::ScriptElement(__return_storage_ptr__,element);
  }
  return __return_storage_ptr__;
}

Assistant:

T next() {
    if (!hasNext()) {
      cfd::core::logger::warn(
          CFD_LOG_SOURCE,
          "Iterator reference out of range."
          " error_message={}.",
          error_message_);
      throw CfdException(kCfdOutOfRangeError, error_message_);
    }
    if (reverse_) {
      return *(reverse_iterator_++);
    }
    return *(iterator_++);
  }